

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryMkdir(DiskHandle *this,PathPtr path,WriteMode mode,bool noThrow)

{
  int iVar1;
  __mode_t __mode;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  PathPtr PVar5;
  PathPtr path_local;
  String filename;
  stat stats;
  
  path_local.parts.size_ = path.parts.size_;
  path_local.parts.ptr = path.parts.ptr;
  PathPtr::toString(&filename,&path_local,false);
  __mode = 0x1c0;
  if ((mode & PRIVATE) == 0) {
    __mode = 0x1ff;
  }
  do {
    pcVar3 = "";
    if (filename.content.size_ != 0) {
      pcVar3 = filename.content.ptr;
    }
    iVar1 = mkdirat((this->fd).fd,pcVar3,__mode);
    bVar4 = true;
    if (-1 < iVar1) goto LAB_0023a7b8;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) goto LAB_0023a7b8;
  if (iVar1 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (path_local.parts.size_ != 0)) {
      PVar5 = PathPtr::parent(&path_local);
      bVar4 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar4) {
        PVar5.parts.size_ = path_local.parts.size_;
        PVar5.parts.ptr = path_local.parts.ptr;
        bVar4 = tryMkdir(this,PVar5,mode & ~CREATE_PARENT,noThrow);
        goto LAB_0023a7b8;
      }
    }
LAB_0023a7ae:
    if (!noThrow) {
LAB_0023a7db:
      _::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&stats,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x35b,iVar1,"mkdirat(fd, path)","path",&path_local);
      _::Debug::Fault::fatal((Fault *)&stats);
    }
  }
  else {
    if (iVar1 != 0x11) goto LAB_0023a7ae;
    if ((mode & MODIFY) != 0) {
      do {
        pcVar3 = "";
        if (filename.content.size_ != 0) {
          pcVar3 = filename.content.ptr;
        }
        iVar2 = 0;
        iVar1 = fstatat((this->fd).fd,pcVar3,(stat *)&stats,0);
      } while ((iVar1 < 0) && (iVar2 = _::Debug::getOsErrorNumber(false), iVar2 == -1));
      if (noThrow || iVar2 == 0) {
        bVar4 = iVar2 == 0 && (stats.st_mode & 0xf000) == 0x4000;
        goto LAB_0023a7b8;
      }
      iVar1 = 0x11;
      goto LAB_0023a7db;
    }
  }
  bVar4 = false;
LAB_0023a7b8:
  Array<char>::~Array(&filename.content);
  return bVar4;
}

Assistant:

bool tryMkdir(PathPtr path, WriteMode mode, bool noThrow) const {
    // Internal function to make a directory.

    auto filename = path.toString();
    mode_t acl = has(mode, WriteMode::PRIVATE) ? 0700 : 0777;

    KJ_SYSCALL_HANDLE_ERRORS(mkdirat(fd, filename.cStr(), acl)) {
      case EEXIST: {
        // Apparently this path exists.
        if (!has(mode, WriteMode::MODIFY)) {
          // Require exclusive create.
          return false;
        }

        // MODIFY is allowed, so we just need to check whether the existing entry is a directory.
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, filename.cStr(), &stats, 0)) {
          default:
            // mkdir() says EEXIST but we can't stat it. Maybe it's a dangling link, or maybe
            // we can't access it for some reason. Assume failure.
            //
            // TODO(someday): Maybe we should be creating the directory at the target of the
            //   link?
            goto failed;
        }
        return (stats.st_mode & S_IFMT) == S_IFDIR;
      }
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
            tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                    WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          return tryMkdir(path, mode - WriteMode::CREATE_PARENT, noThrow);
        } else {
          goto failed;
        }
      default:
      failed:
        if (noThrow) {
          // Caller requested no throwing.
          return false;
        } else {
          KJ_FAIL_SYSCALL("mkdirat(fd, path)", error, path);
        }
    }

    return true;
  }